

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O1

exr_result_t
LossyDctEncoder_base_construct
          (LossyDctEncoder *e,float quantBaseError,uint8_t *packedAc,uint8_t *packedDc,
          uint16_t *toNonlinear,int width,int height)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar21;
  uint uVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  long lVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar47;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uint uVar48;
  uint uVar53;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint uVar57;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint uVar73;
  undefined1 in_XMM15 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  
  e->_quantBaseError = quantBaseError;
  e->_width = width;
  e->_height = height;
  e->_toNonlinear = toNonlinear;
  e->_numAcComp = 0;
  e->_numDcComp = 0;
  e->_packedAc = packedAc;
  e->_packedDc = packedDc;
  if (quantBaseError < 0.0) {
    e->_quantBaseError = 0.0;
  }
  fVar1 = e->_quantBaseError;
  lVar4 = -0x80;
  lVar5 = 0;
  do {
    auVar22._0_4_ = (float)*(int *)(&DAT_00176680 + lVar5) * fVar1;
    auVar22._4_4_ = (float)*(int *)(&UNK_00176684 + lVar5) * fVar1;
    auVar22._8_4_ = (float)*(int *)(&UNK_00176688 + lVar5) * fVar1;
    auVar22._12_4_ = (float)*(int *)(&UNK_0017668c + lVar5) * fVar1;
    auVar23 = divps(auVar22,_DAT_001764c0);
    *(undefined1 (*) [16])((long)e->_quantTableY + lVar5) = auVar23;
    uVar20 = auVar23._12_4_;
    uVar57 = auVar23._0_4_ & (uint)DAT_00176110;
    uVar62 = auVar23._4_4_ & DAT_00176110._4_4_;
    uVar28 = auVar23._8_4_;
    uVar63 = uVar28 & DAT_00176110._8_4_;
    uVar64 = uVar20 & DAT_00176110._12_4_;
    auVar14._0_4_ = auVar23._0_4_ >> 0x10;
    auVar14._4_4_ = auVar23._4_4_ >> 0x10;
    auVar14._8_4_ = uVar28 >> 0x10;
    auVar14._12_4_ = uVar20 >> 0x10;
    auVar6 = pshuflw(_DAT_00176110,auVar14,0xe8);
    auVar6 = pshufhw(auVar6,auVar6,0xe8);
    auVar39._0_4_ = -(uint)((int)(uVar57 | 0x80000000) < -0x4cffffff);
    auVar39._4_4_ = -(uint)((int)(uVar62 | 0x80000000) < -0x4cffffff);
    auVar39._8_4_ = -(uint)((int)(uVar63 | 0x80000000) < -0x4cffffff);
    auVar39._12_4_ = -(uint)((int)(uVar64 | 0x80000000) < -0x4cffffff);
    auVar54._0_4_ = -(uint)(-0x47800001 < (int)(uVar57 | 0x80000000));
    auVar54._4_4_ = -(uint)(-0x47800001 < (int)(uVar62 | 0x80000000));
    auVar54._8_4_ = -(uint)(-0x47800001 < (int)(uVar63 | 0x80000000));
    auVar54._12_4_ = -(uint)(-0x47800001 < (int)(uVar64 | 0x80000000));
    uVar3 = CONCAT44(auVar6._8_4_,auVar6._0_4_) & (ulong)DAT_00176120;
    auVar6._0_4_ = 0x7e - (uVar57 >> 0x17);
    auVar6._4_4_ = 0x7e - (uVar62 >> 0x17);
    auVar6._8_4_ = 0x7e - (uVar63 >> 0x17);
    auVar6._12_4_ = 0x7e - (uVar64 >> 0x17);
    auVar24._0_8_ = auVar23._0_8_ & 0x7fffff007fffff;
    auVar24._8_4_ = uVar28 & 0x7fffff;
    auVar24._12_4_ = uVar20 & 0x7fffff;
    auVar54 = auVar54 ^ auVar39;
    auVar24 = auVar24 | _DAT_00176180;
    auVar29._0_4_ = (float)(((uVar57 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar29._4_4_ = (float)(((uVar62 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar29._8_4_ = (float)(((uVar63 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar29._12_4_ = (float)(((uVar64 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    iVar47 = (int)auVar29._4_4_;
    uVar21 = auVar24._0_4_;
    uVar27 = auVar24._4_4_;
    uVar20 = auVar24._8_4_;
    uVar28 = auVar24._12_4_;
    auVar40 = packssdw(auVar39,auVar39);
    auVar23 = pshuflw(auVar29,auVar6,0xfe);
    lVar38 = auVar23._0_8_;
    auVar49._0_4_ = uVar21 >> lVar38;
    auVar49._4_4_ = uVar27 >> lVar38;
    auVar49._8_4_ = uVar20 >> lVar38;
    auVar49._12_4_ = uVar28 >> lVar38;
    auVar67._4_4_ = uVar27;
    auVar67._0_4_ = uVar27;
    auVar67._8_4_ = uVar28;
    auVar67._12_4_ = uVar28;
    auVar23 = pshuflw(in_XMM15,auVar6,0x54);
    auVar30._0_4_ = uVar21 >> auVar23._0_8_;
    auVar71._4_4_ = iVar47;
    auVar71._0_4_ = iVar47;
    auVar71._8_4_ = (int)auVar29._12_4_;
    auVar71._12_4_ = (int)auVar29._12_4_;
    auVar23._4_4_ = auVar6._12_4_;
    auVar23._0_4_ = auVar6._8_4_;
    auVar23._8_4_ = auVar6._8_4_;
    auVar23._12_4_ = auVar6._12_4_;
    auVar6 = pshuflw(auVar49,auVar23,0xfe);
    lVar38 = auVar6._0_8_;
    auVar42._0_4_ = uVar21 >> lVar38;
    auVar42._4_4_ = uVar27 >> lVar38;
    auVar42._8_4_ = uVar20 >> lVar38;
    auVar42._12_4_ = uVar28 >> lVar38;
    auVar6 = pshuflw(auVar23,auVar23,0x54);
    uVar65 = (uint)((auVar24._8_8_ & 0xffffffff) * (ulong)(uint)(int)auVar29._8_4_);
    auVar30._4_4_ = auVar49._4_4_;
    auVar30._8_4_ = uVar20 >> auVar6._0_8_;
    auVar30._12_4_ = auVar42._12_4_;
    auVar6 = pshuflw(_DAT_001761b0,auVar30,0xe8);
    uVar73 = (uint)((auVar71._8_8_ & 0xffffffff) * (ulong)uVar28);
    auVar6 = pshufhw(auVar6,auVar6,0xe8);
    auVar23 = pshuflw(auVar42,auVar14 & _DAT_001761b0,0xe8);
    auVar68 = pshufhw(auVar67,auVar23,0xe8);
    auVar68 = auVar68 | auVar6;
    auVar30 = auVar30 & _DAT_00136070;
    auVar31._0_4_ = -(uint)(auVar30._0_4_ == 0);
    auVar31._4_4_ = -(uint)(auVar30._4_4_ == 0);
    auVar31._8_4_ = -(uint)(auVar30._8_4_ == 0);
    auVar31._12_4_ = -(uint)(auVar30._12_4_ == 0);
    auVar35._0_4_ = -(uint)(-0x80000000 < (int)(uVar21 * (int)auVar29._0_4_));
    auVar35._4_4_ = -(uint)(-0x80000000 < (int)(iVar47 * uVar27));
    auVar35._8_4_ = -(uint)(-0x80000000 < (int)uVar65);
    auVar35._12_4_ = -(uint)(-0x80000000 < (int)uVar73);
    uVar20 = uVar57 + 0xc7800000 ^ 0x80000000;
    uVar28 = uVar62 + 0xc7800000 ^ 0x80000000;
    uVar48 = uVar63 + 0xc7800000 ^ 0x80000000;
    uVar53 = uVar64 + 0xc7800000 ^ 0x80000000;
    auVar43._0_4_ = uVar57 >> 0xd;
    auVar43._4_4_ = uVar62 >> 0xd;
    auVar43._8_4_ = uVar63 >> 0xd;
    auVar43._12_4_ = uVar64 >> 0xd;
    auVar23 = auVar43 & _DAT_00136070;
    auVar69._0_4_ = -(uint)((int)uVar20 < 0x7a800001);
    auVar69._4_4_ = -(uint)((int)uVar28 < 0x7a800001);
    auVar69._8_4_ = -(uint)((int)uVar48 < 0x7a800001);
    auVar69._12_4_ = -(uint)((int)uVar53 < 0x7a800001);
    auVar7._0_4_ = -(uint)(-0x71001001 < (int)uVar20);
    auVar7._4_4_ = -(uint)(-0x71001001 < (int)uVar28);
    auVar7._8_4_ = -(uint)(-0x71001001 < (int)uVar48);
    auVar7._12_4_ = -(uint)(-0x71001001 < (int)uVar53);
    auVar50._0_4_ = -(uint)(0 < (int)(uVar21 * (int)auVar29._0_4_ ^ 0x80000000));
    auVar50._4_4_ = -(uint)(0 < (int)(iVar47 * uVar27 ^ 0x80000000));
    auVar50._8_4_ = -(uint)(0 < (int)(uVar65 ^ 0x80000000));
    auVar50._12_4_ = -(uint)(0 < (int)(uVar73 ^ 0x80000000));
    auVar6 = packssdw(auVar7,auVar7);
    auVar72._0_4_ = uVar57 + 0x8000fff + auVar23._0_4_ >> 0xd;
    auVar72._4_4_ = uVar62 + 0x8000fff + auVar23._4_4_ >> 0xd;
    auVar72._8_4_ = uVar63 + 0x8000fff + auVar23._8_4_ >> 0xd;
    auVar72._12_4_ = uVar64 + 0x8000fff + auVar23._12_4_ >> 0xd;
    auVar23 = pshuflw(auVar23,auVar72 | auVar14 & _DAT_001761b0,0xe8);
    auVar23 = pshufhw(auVar23,auVar23,0xe8);
    auVar43 = auVar43 & _DAT_00176230;
    auVar44._0_4_ = -(uint)(auVar43._0_4_ == 0);
    auVar44._4_4_ = -(uint)(auVar43._4_4_ == 0);
    auVar44._8_4_ = -(uint)(auVar43._8_4_ == 0);
    auVar44._12_4_ = -(uint)(auVar43._12_4_ == 0);
    auVar7 = packssdw(auVar44,auVar44);
    auVar44 = packssdw(auVar43,auVar43);
    auVar36._8_4_ = 0xffffffff;
    auVar36._0_8_ = 0xffffffffffffffff;
    auVar36._12_4_ = 0xffffffff;
    auVar55._0_4_ = -(uint)(-0x47fff001 < (int)(uVar57 + 0xb8801000 ^ 0x80000000));
    auVar55._4_4_ = -(uint)(-0x47fff001 < (int)(uVar62 + 0xb8801000 ^ 0x80000000));
    auVar55._8_4_ = -(uint)(-0x47fff001 < (int)(uVar63 + 0xb8801000 ^ 0x80000000));
    auVar55._12_4_ = -(uint)(-0x47fff001 < (int)(uVar64 + 0xb8801000 ^ 0x80000000));
    auVar8 = packssdw(auVar55,auVar55);
    auVar55 = ~auVar54 & auVar50 | (auVar54 | auVar50 | auVar31 | auVar35) ^ auVar36;
    uVar2 = uVar3 | (ulong)DAT_00176210;
    auVar25 = ~(auVar54 | auVar50) & (auVar31 | auVar35);
    auVar58._0_4_ = -(uint)(uVar57 == 0x7f800000);
    auVar58._4_4_ = -(uint)(uVar62 == 0x7f800000);
    auVar58._8_4_ = -(uint)(uVar63 == 0x7f800000);
    auVar58._12_4_ = -(uint)(uVar64 == 0x7f800000);
    auVar59 = packssdw(auVar58,auVar58);
    auVar32._0_2_ = auVar68._0_2_ + 1;
    auVar32._2_2_ = auVar68._2_2_ + 1;
    auVar32._4_2_ = auVar68._8_2_ + 1;
    auVar32._6_2_ = auVar68._10_2_ + 1;
    auVar32._8_2_ = auVar68._8_2_ + 1;
    auVar32._10_2_ = auVar68._10_2_ + 1;
    auVar32._12_2_ = auVar68._12_2_ + 1;
    auVar32._14_2_ = auVar68._14_2_ + 1;
    auVar25 = packssdw(auVar25,auVar25);
    auVar25 = psllw(auVar25,0xf);
    auVar25 = psraw(auVar25,0xf);
    auVar55 = packssdw(auVar55,auVar55);
    auVar55 = psllw(auVar55,0xf);
    auVar55 = psraw(auVar55,0xf);
    *(ulong *)((long)e->_quantTableCbCr + lVar4) =
         ~auVar25._0_8_ &
         (~auVar55._0_8_ &
          (~auVar40._0_8_ &
           (~auVar59._0_8_ &
            (~auVar6._0_8_ & CONCAT44(auVar23._8_4_,auVar23._0_4_) |
            ((auVar44._0_8_ |
              CONCAT26(auVar7._6_2_ >> 0xf,
                       CONCAT24(auVar7._4_2_ >> 0xf,
                                CONCAT22(auVar7._2_2_ >> 0xf,auVar7._0_2_ >> 0xf))) | uVar2) &
             auVar8._0_8_ | ~auVar8._0_8_ & uVar2) & auVar6._0_8_) | uVar2 & auVar59._0_8_) |
          uVar3 & auVar40._0_8_) | SUB168(auVar32 & auVar55,0)) |
         CONCAT44(auVar68._8_4_,auVar68._0_4_) & auVar25._0_8_;
    auVar15._0_4_ = (float)*(int *)(&DAT_00176780 + lVar5) * fVar1;
    auVar15._4_4_ = (float)*(int *)(&UNK_00176784 + lVar5) * fVar1;
    auVar15._8_4_ = (float)*(int *)(&UNK_00176788 + lVar5) * fVar1;
    auVar15._12_4_ = (float)*(int *)(&UNK_0017678c + lVar5) * fVar1;
    auVar23 = divps(auVar15,_DAT_001764e0);
    auVar69 = auVar69 | auVar54 ^ auVar36;
    *(undefined1 (*) [16])((long)e->_quantTableCbCr + lVar5) = auVar23;
    uVar20 = auVar23._12_4_;
    uVar65 = auVar23._0_4_ & 0x7fffffff;
    uVar57 = auVar23._4_4_ & 0x7fffffff;
    uVar28 = auVar23._8_4_;
    uVar62 = uVar28 & 0x7fffffff;
    uVar63 = uVar20 & 0x7fffffff;
    auVar45._0_4_ = auVar23._0_4_ >> 0x10;
    auVar45._4_4_ = auVar23._4_4_ >> 0x10;
    auVar45._8_4_ = uVar28 >> 0x10;
    auVar45._12_4_ = uVar20 >> 0x10;
    auVar6 = pshuflw(auVar54 ^ auVar36,auVar45,0xe8);
    uVar48 = uVar65 | 0x80000000;
    uVar53 = uVar57 | 0x80000000;
    uVar21 = uVar62 | 0x80000000;
    uVar27 = uVar63 | 0x80000000;
    auVar26._0_4_ = -(uint)(-0x47800001 < (int)uVar48);
    auVar26._4_4_ = -(uint)(-0x47800001 < (int)uVar53);
    auVar26._8_4_ = -(uint)(-0x47800001 < (int)uVar21);
    auVar26._12_4_ = -(uint)(-0x47800001 < (int)uVar27);
    auVar59._0_4_ = 0x7e - (uVar65 >> 0x17);
    auVar59._4_4_ = 0x7e - (uVar57 >> 0x17);
    auVar59._8_4_ = 0x7e - (uVar62 >> 0x17);
    auVar59._12_4_ = 0x7e - (uVar63 >> 0x17);
    auVar16._0_8_ = auVar23._0_8_ & 0x7fffff007fffff;
    auVar16._8_4_ = uVar28 & 0x7fffff;
    auVar16._12_4_ = uVar20 & 0x7fffff;
    auVar16 = auVar16 | _DAT_00176180;
    auVar7 = pshuflw(auVar32 & auVar55,auVar59,0xfe);
    auVar23 = pshuflw(auVar7,auVar59,0x54);
    auVar60._0_4_ = auVar16._0_4_ >> auVar23._0_8_;
    auVar68._4_4_ = auVar59._12_4_;
    auVar68._0_4_ = auVar59._8_4_;
    auVar68._8_4_ = auVar59._8_4_;
    auVar68._12_4_ = auVar59._12_4_;
    auVar25 = pshuflw(auVar23,auVar68,0xfe);
    auVar8._0_4_ = (uint)(float)(((uVar65 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar8._4_4_ = (int)(float)(((uVar57 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar8._8_4_ = (uint)(float)(((uVar62 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar8._12_4_ = (int)(float)(((uVar63 >> 0x17) - 0x5e) * 0x800000 + 0x3f800000);
    auVar33._0_8_ = (ulong)auVar16._0_4_ * (ulong)auVar8._0_4_;
    auVar33._8_8_ = (auVar16._8_8_ & 0xffffffff) * (ulong)auVar8._8_4_;
    auVar37._4_4_ = auVar8._4_4_;
    auVar37._0_4_ = auVar8._4_4_;
    auVar37._8_4_ = auVar8._12_4_;
    auVar37._12_4_ = auVar8._12_4_;
    uVar20 = auVar8._4_4_ * auVar16._4_4_;
    lVar38 = (auVar37._8_8_ & 0xffffffff) * (ulong)auVar16._12_4_;
    auVar41._0_4_ = -(uint)((int)uVar48 < -0x4cffffff);
    auVar41._4_4_ = -(uint)((int)uVar53 < -0x4cffffff);
    auVar41._8_4_ = -(uint)((int)uVar21 < -0x4cffffff);
    auVar41._12_4_ = -(uint)((int)uVar27 < -0x4cffffff);
    auVar23 = pshuflw(auVar8,auVar68,0x54);
    in_XMM15 = ~auVar26 & auVar69;
    auVar60._4_4_ = auVar16._4_4_ >> auVar7._0_8_;
    auVar60._8_4_ = auVar16._8_4_ >> auVar23._0_8_;
    auVar60._12_4_ = auVar16._12_4_ >> auVar25._0_8_;
    uVar28 = (uint)lVar38;
    auVar17._4_4_ = uVar28;
    auVar17._0_4_ = uVar20;
    auVar17._8_4_ = uVar28;
    auVar17._12_4_ = (int)((ulong)lVar38 >> 0x20);
    auVar23 = pshuflw(auVar33,auVar60,0xe8);
    auVar7 = pshufhw(auVar23,auVar23,0xe8);
    auVar23 = pshuflw(auVar17,auVar45 & _DAT_001761b0,0xe8);
    auVar44 = pshufhw(auVar23,auVar23,0xe8);
    auVar44 = auVar44 | auVar7;
    auVar34._0_4_ = -(uint)(0 < (int)((uint)auVar33._0_8_ ^ 0x80000000));
    auVar34._4_4_ = -(uint)(0 < (int)(uVar20 ^ 0x80000000));
    auVar34._8_4_ = -(uint)(0 < (int)((uint)auVar33._8_8_ ^ 0x80000000));
    auVar34._12_4_ = -(uint)(0 < (int)(uVar28 ^ 0x80000000));
    auVar9._0_4_ = -(uint)(-0x80000000 < (int)(uint)auVar33._0_8_);
    auVar9._4_4_ = -(uint)(-0x80000000 < (int)uVar20);
    auVar9._8_4_ = -(uint)(-0x80000000 < (int)(uint)auVar33._8_8_);
    auVar9._12_4_ = -(uint)(-0x80000000 < (int)uVar28);
    auVar60 = auVar60 & _DAT_00136070;
    auVar61._0_4_ = -(uint)(auVar60._0_4_ == 0);
    auVar61._4_4_ = -(uint)(auVar60._4_4_ == 0);
    auVar61._8_4_ = -(uint)(auVar60._8_4_ == 0);
    auVar61._12_4_ = -(uint)(auVar60._12_4_ == 0);
    auVar26 = auVar26 & auVar69;
    auVar56._0_4_ = uVar65 >> 0xd;
    auVar56._4_4_ = uVar57 >> 0xd;
    auVar56._8_4_ = uVar62 >> 0xd;
    auVar56._12_4_ = uVar63 >> 0xd;
    auVar55 = ~auVar34 & ~auVar41 & in_XMM15;
    auVar23 = auVar56 & _DAT_00136070;
    auVar51._0_4_ = -(uint)(-0x38801001 < (int)uVar48);
    auVar51._4_4_ = -(uint)(-0x38801001 < (int)uVar53);
    auVar51._8_4_ = -(uint)(-0x38801001 < (int)uVar21);
    auVar51._12_4_ = -(uint)(-0x38801001 < (int)uVar27);
    auVar10._0_4_ = -(uint)(-0x800001 < (int)uVar48);
    auVar10._4_4_ = -(uint)(-0x800001 < (int)uVar53);
    auVar10._8_4_ = -(uint)(-0x800001 < (int)uVar21);
    auVar10._12_4_ = -(uint)(-0x800001 < (int)uVar27);
    auVar70._0_4_ = uVar65 + 0x8000fff + auVar23._0_4_ >> 0xd;
    auVar70._4_4_ = uVar57 + 0x8000fff + auVar23._4_4_ >> 0xd;
    auVar70._8_4_ = uVar62 + 0x8000fff + auVar23._8_4_ >> 0xd;
    auVar70._12_4_ = uVar63 + 0x8000fff + auVar23._12_4_ >> 0xd;
    auVar7 = ~auVar10 & auVar26;
    auVar23 = ~auVar51 & auVar7;
    auVar56 = auVar56 & _DAT_00176230;
    auVar11._0_4_ = -(uint)(auVar56._0_4_ == 0);
    auVar11._4_4_ = -(uint)(auVar56._4_4_ == 0);
    auVar11._8_4_ = -(uint)(auVar56._8_4_ == 0);
    auVar11._12_4_ = -(uint)(auVar56._12_4_ == 0);
    auVar8 = packssdw(auVar11,auVar11);
    auVar40 = packssdw(auVar56,auVar56);
    auVar12._0_2_ = auVar8._0_2_ >> 0xf;
    auVar12._2_2_ = auVar8._2_2_ >> 0xf;
    auVar12._4_2_ = auVar8._4_2_ >> 0xf;
    auVar12._6_2_ = auVar8._6_2_ >> 0xf;
    auVar12._8_2_ = auVar8._8_2_ >> 0xf;
    auVar12._10_2_ = auVar8._10_2_ >> 0xf;
    auVar12._12_2_ = auVar8._12_2_ >> 0xf;
    auVar12._14_2_ = auVar8._14_2_ >> 0xf;
    auVar6 = pshufhw(auVar12,auVar6,0xe8);
    auVar46._4_4_ = auVar6._8_4_;
    auVar46._0_4_ = auVar6._0_4_;
    auVar46._8_4_ = auVar6._8_4_;
    auVar46._12_4_ = auVar6._12_4_;
    auVar6 = pshuflw(auVar6,auVar51 & auVar7,0xe8);
    auVar6 = pshufhw(auVar6,auVar6,0xe8);
    auVar66._0_4_ = -(uint)(uVar65 == 0x7f800000);
    auVar66._4_4_ = -(uint)(uVar57 == 0x7f800000);
    auVar66._8_4_ = -(uint)(uVar62 == 0x7f800000);
    auVar66._12_4_ = -(uint)(uVar63 == 0x7f800000);
    auVar52._4_4_ = auVar6._8_4_;
    auVar52._0_4_ = auVar6._0_4_;
    auVar52._8_4_ = auVar6._8_4_;
    auVar52._12_4_ = auVar6._12_4_;
    auVar66 = auVar66 & auVar26;
    auVar8 = auVar46 & _DAT_00176120 | _DAT_00176210;
    auVar6 = psllw(auVar52,0xf);
    auVar7 = psraw(auVar6,0xf);
    auVar6 = pshuflw(auVar23,auVar23,0xe8);
    auVar6 = pshufhw(auVar6,auVar6,0xe8);
    auVar25._0_4_ = auVar6._0_4_;
    auVar25._8_4_ = auVar6._8_4_;
    auVar25._12_4_ = auVar6._12_4_;
    auVar25._4_4_ = auVar25._8_4_;
    auVar6 = psllw(auVar25,0xf);
    auVar6 = psraw(auVar6,0xf);
    auVar23 = pshuflw(auVar8 & auVar7,auVar70 | auVar45 & _DAT_001761b0,0xe8);
    auVar23 = pshufhw(auVar23,auVar23,0xe8);
    auVar13._0_4_ = auVar23._0_4_;
    auVar13._8_4_ = auVar23._8_4_;
    auVar13._12_4_ = auVar23._12_4_;
    auVar13._4_4_ = auVar13._8_4_;
    auVar6 = ~auVar6 & (~auVar7 & (auVar40 | auVar12 | auVar8) | auVar8 & auVar7) | auVar13 & auVar6
    ;
    auVar23 = packssdw(auVar66,auVar66);
    auVar23 = psllw(auVar23,0xf);
    auVar59 = psraw(auVar23,0xf);
    auVar23 = packssdw(auVar41 & in_XMM15,auVar41 & in_XMM15);
    auVar23 = psllw(auVar23,0xf);
    auVar25 = psraw(auVar23,0xf);
    auVar23 = pshuflw(auVar6,auVar34 & ~auVar41 & in_XMM15 | ~(auVar61 | auVar9) & auVar55,0xe8);
    auVar23 = pshufhw(auVar23,auVar23,0xe8);
    auVar40._0_4_ = auVar23._0_4_;
    auVar40._8_4_ = auVar23._8_4_;
    auVar40._12_4_ = auVar23._12_4_;
    auVar40._4_4_ = auVar40._8_4_;
    auVar23 = psllw(auVar40,0xf);
    auVar23 = psraw(auVar23,0xf);
    auVar18._0_2_ = auVar44._0_2_ + 1;
    auVar18._2_2_ = auVar44._2_2_ + 1;
    auVar18._4_2_ = auVar44._8_2_ + 1;
    auVar18._6_2_ = auVar44._10_2_ + 1;
    auVar18._8_2_ = auVar44._8_2_ + 1;
    auVar18._10_2_ = auVar44._10_2_ + 1;
    auVar18._12_2_ = auVar44._12_2_ + 1;
    auVar18._14_2_ = auVar44._14_2_ + 1;
    auVar7 = pshuflw(auVar18 & auVar23,(auVar61 | auVar9) & auVar55,0xe8);
    auVar7 = pshufhw(auVar7,auVar7,0xe8);
    auVar19._0_4_ = auVar7._0_4_;
    auVar19._8_4_ = auVar7._8_4_;
    auVar19._12_4_ = auVar7._12_4_;
    auVar19._4_4_ = auVar19._8_4_;
    auVar7 = psllw(auVar19,0xf);
    auVar7 = psraw(auVar7,0xf);
    *(ulong *)((long)e[1]._channel_encode_data + lVar4 + -0x18) =
         ~auVar7._0_8_ &
         (~auVar23._0_8_ &
          (~auVar25._0_8_ & (~auVar59._0_8_ & auVar6._0_8_ | auVar8._0_8_ & auVar59._0_8_) |
          SUB168(auVar46 & _DAT_00176120,0) & auVar25._0_8_) | SUB168(auVar18 & auVar23,0)) |
         CONCAT44(auVar44._8_4_,auVar44._0_4_) & auVar7._0_8_;
    lVar5 = lVar5 + 0x10;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0);
  *(undefined8 *)((long)e->_channel_encode_data + 0xc) = 0;
  *(undefined8 *)((long)e->_channel_encode_data + 0x14) = 0;
  e->_channel_encode_data[0] = (DctCoderChannelData *)0x0;
  e->_channel_encode_data[1] = (DctCoderChannelData *)0x0;
  return 0;
}

Assistant:

exr_result_t
LossyDctEncoder_base_construct (
    LossyDctEncoder* e,
    float            quantBaseError,
    uint8_t*         packedAc,
    uint8_t*         packedDc,
    const uint16_t*  toNonlinear,
    int              width,
    int              height)
{
    //
    // Here, we take the generic JPEG quantization tables and
    // normalize them by the smallest component in each table.
    // This gives us a relationship amongst the DCT components,
    // in terms of how sensitive each component is to
    // error.
    //
    // A higher normalized value means we can quantize more,
    // and a small normalized value means we can quantize less.
    //
    // Eventually, we will want an acceptable quantization
    // error range for each component. We find this by
    // multiplying some user-specified level (_quantBaseError)
    // by the normalized table (_quantTableY, _quantTableCbCr) to
    // find the acceptable quantization error range.
    //
    // The quantization table is not needed for decoding, and
    // is not transmitted. So, if you want to get really fancy,
    // you could derive some content-dependent quantization
    // table, and the decoder would not need to be changed. But,
    // for now, we'll just use static quantization tables.
    //
    int jpegQuantTableY[] = {
        16, 11, 10, 16, 24,  40,  51,  61,  12, 12, 14, 19, 26,  58,  60,  55,
        14, 13, 16, 24, 40,  57,  69,  56,  14, 17, 22, 29, 51,  87,  80,  62,
        18, 22, 37, 56, 68,  109, 103, 77,  24, 35, 55, 64, 81,  104, 113, 92,
        49, 64, 78, 87, 103, 121, 120, 101, 72, 92, 95, 98, 112, 100, 103, 99};

    int jpegQuantTableYMin = 10;

    int jpegQuantTableCbCr[] = {
        17, 18, 24, 47, 99, 99, 99, 99, 18, 21, 26, 66, 99, 99, 99, 99,
        24, 26, 56, 99, 99, 99, 99, 99, 47, 66, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99};

    int jpegQuantTableCbCrMin = 17;

    e->_quantBaseError = quantBaseError;
    e->_width          = width;
    e->_height         = height;
    e->_toNonlinear    = toNonlinear;
    e->_numAcComp      = 0;
    e->_numDcComp      = 0;
    e->_packedAc       = packedAc;
    e->_packedDc       = packedDc;
    if (e->_quantBaseError < 0) e->_quantBaseError = 0;

    for (int idx = 0; idx < 64; ++idx)
    {
        e->_quantTableY[idx] =
            (e->_quantBaseError * (float) (jpegQuantTableY[idx]) /
             (float) (jpegQuantTableYMin));
        e->_hquantTableY[idx] = float_to_half (e->_quantTableY[idx]);

        e->_quantTableCbCr[idx] =
            (e->_quantBaseError * (float) (jpegQuantTableCbCr[idx]) /
             (float) (jpegQuantTableCbCrMin));
        e->_hquantTableCbCr[idx] = float_to_half (e->_quantTableCbCr[idx]);
    }

    e->_channel_encode_data[0]    = NULL;
    e->_channel_encode_data[1]    = NULL;
    e->_channel_encode_data[2]    = NULL;
    e->_channel_encode_data_count = 0;

    return EXR_ERR_SUCCESS;
}